

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Routing.cpp
# Opt level: O2

int Routing::GetFloatParameterCallback
              (UnityAudioEffectState *state,int index,float *value,char *valuestr)

{
  int iVar1;
  EffectData *pEVar2;
  
  pEVar2 = UnityAudioEffectState::GetEffectData<Routing::EffectData>(state);
  if (index < 1) {
    if (value != (float *)0x0) {
      *value = pEVar2[index].p[0];
    }
    iVar1 = 0;
    if (valuestr != (char *)0x0) {
      *valuestr = '\0';
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK GetFloatParameterCallback(UnityAudioEffectState* state, int index, float* value, char *valuestr)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        if (index >= P_NUM)
            return UNITY_AUDIODSP_ERR_UNSUPPORTED;
        if (value != NULL)
            *value = data->p[index];
        if (valuestr != NULL)
            valuestr[0] = 0;
        return UNITY_AUDIODSP_OK;
    }